

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall FfsParser::parseVersionSectionBody(FfsParser *this,UModelIndex *index)

{
  TreeModel *this_00;
  UModelIndex *index_00;
  bool bVar1;
  char *str;
  UByteArray local_88;
  CBString local_68;
  CBString local_50;
  CBString local_38;
  UModelIndex *local_20;
  UModelIndex *index_local;
  FfsParser *this_local;
  
  local_20 = index;
  index_local = (UModelIndex *)this;
  bVar1 = UModelIndex::isValid(index);
  index_00 = local_20;
  if (bVar1) {
    this_00 = this->model;
    Bstrlib::CBString::CBString(&local_50,"\nVersion string: ");
    TreeModel::body(&local_88,this->model,local_20);
    str = UByteArray::constData(&local_88);
    uFromUcs2(&local_68,str,0);
    Bstrlib::CBString::operator+(&local_38,&local_50,&local_68);
    TreeModel::addInfo(this_00,index_00,&local_38,true);
    Bstrlib::CBString::~CBString(&local_38);
    Bstrlib::CBString::~CBString(&local_68);
    UByteArray::~UByteArray(&local_88);
    Bstrlib::CBString::~CBString(&local_50);
  }
  this_local = (FfsParser *)(ulong)!bVar1;
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parseVersionSectionBody(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Add info
    model->addInfo(index, UString("\nVersion string: ") + uFromUcs2(model->body(index).constData()));
    
    return U_SUCCESS;
}